

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O0

void __thiscall DBot::ThinkForMove(DBot *this,ticcmd_t *cmd)

{
  double *pdVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  AActor *pAVar6;
  PClass *pPVar7;
  undefined2 uVar8;
  double dVar9;
  bool local_211;
  bool local_179;
  byte local_152;
  byte local_151;
  DObject *local_148;
  DVector3 local_138;
  TVector2<double> local_120;
  AInventory *local_110;
  AInventory *item;
  TThinkerIterator<AInventory> it;
  TFlags<ActorFlag,_unsigned_int> local_e4;
  TAngle<double> local_e0;
  undefined1 local_d8 [16];
  double matedist;
  TFlags<ActorFlag3,_unsigned_int> local_c0;
  TFlags<ActorFlag3,_unsigned_int> local_bc;
  undefined1 local_b8 [32];
  TVector3<double> local_98;
  TFlags<ActorFlag3,_unsigned_int> local_7c;
  Self local_78;
  TFlags<ActorFlag,_unsigned_int> local_74;
  TAngle<double> local_70;
  DVector3 local_68;
  TVector3<double> local_50;
  undefined1 local_38 [24];
  int r;
  bool stuck;
  double dist;
  ticcmd_t *cmd_local;
  DBot *this_local;
  
  local_38[0x17] = 0;
  dist = (double)cmd;
  cmd_local = (ticcmd_t *)this;
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
  if (pAVar6 == (AActor *)0x0) {
    local_148 = (DObject *)0x0;
  }
  else {
    pAVar2 = this->player->mo;
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
    local_148 = (DObject *)AActor::Distance2D(&pAVar2->super_AActor,pAVar6,false);
  }
  _r = (double)local_148;
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
  local_151 = 0;
  if (pAVar6 != (AActor *)0x0) {
    pAVar6 = TObjPtr<AActor>::operator->(&this->missile);
    dVar9 = (pAVar6->Vel).X;
    local_152 = 1;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      pAVar6 = TObjPtr<AActor>::operator->(&this->missile);
      dVar9 = (pAVar6->Vel).Y;
      local_152 = 1;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
        TAngle<double>::TAngle((TAngle<double> *)(local_38 + 8),90.0);
        bVar3 = Check_LOS(this,pAVar6,(DAngle *)(local_38 + 8));
        local_152 = bVar3 ^ 0xff;
      }
    }
    local_151 = local_152;
  }
  if ((local_151 & 1) != 0) {
    this->sleft = (bool)((this->sleft ^ 0xffU) & 1);
    TObjPtr<AActor>::operator=(&this->missile,(AActor *)0x0);
  }
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
  if (pAVar6 != (AActor *)0x0) {
    pAVar2 = this->player->mo;
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
    dVar9 = AActor::Distance2D(&pAVar2->super_AActor,pAVar6,false);
    if (dVar9 < 686.6455078125) {
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
      Pitch(this,pAVar6);
      pAVar2 = this->player->mo;
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile);
      AActor::AngleTo((AActor *)local_38,&pAVar2->super_AActor,SUB81(pAVar6,0));
      TAngle<double>::operator=(&this->Angle,(TAngle<double> *)local_38);
      uVar8 = 0x2800;
      if ((this->sleft & 1U) != 0) {
        uVar8 = 0xd800;
      }
      *(undefined2 *)((long)dist + 0xc) = uVar8;
      *(undefined2 *)((long)dist + 10) = 0xce00;
      AActor::Pos(&local_68,&this->player->mo->super_AActor);
      operator-(&local_50,&local_68,&this->old);
      dVar9 = TVector3<double>::LengthSquared(&local_50);
      bVar3 = false;
      if (dVar9 < 0.5820766091346741) {
        bVar3 = this->t_strafe < 1;
      }
      if (bVar3) {
        this->t_strafe = 5;
        this->sleft = (bool)((this->sleft ^ 0xffU) & 1);
      }
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      local_179 = false;
      if (pAVar6 != (AActor *)0x0) {
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
        TAngle<double>::TAngle(&local_70,60.0);
        local_179 = Check_LOS(this,pAVar6,&local_70);
      }
      if (local_179 != false) {
        Dofire(this,(ticcmd_t *)dist);
      }
      goto LAB_00565705;
    }
  }
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  if (pAVar6 == (AActor *)0x0) {
LAB_0056501a:
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
    if ((pAVar6 == (AActor *)0x0) ||
       (pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy),
       pAVar6 != (AActor *)0x0)) {
LAB_00565226:
      this->first_shot = true;
    }
    else {
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
      if (pAVar6 != (AActor *)0x0) {
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
        bVar3 = TObjPtr<AActor>::operator==(&this->dest,pAVar6);
        if (!bVar3) goto LAB_00565226;
      }
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
      Pitch(this,pAVar6);
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
      bVar3 = Reachable(this,pAVar6);
      if (bVar3) {
        pAVar2 = this->player->mo;
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
        AActor::AngleTo((AActor *)local_d8,&pAVar2->super_AActor,SUB81(pAVar6,0));
        TAngle<double>::operator=(&this->Angle,(TAngle<double> *)local_d8);
        pAVar2 = this->player->mo;
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
        local_d8._8_8_ = AActor::Distance2D(&pAVar2->super_AActor,pAVar6,false);
        if ((double)local_d8._8_8_ <= 457.763671875) {
          if ((double)local_d8._8_8_ <= 228.8818359375) {
            if ((double)local_d8._8_8_ < 152.587890625) {
              *(undefined2 *)((long)dist + 10) = 0xe700;
            }
          }
          else {
            *(undefined2 *)((long)dist + 10) = 0x1900;
          }
        }
        else {
          *(undefined2 *)((long)dist + 10) = 0x3200;
        }
        goto LAB_00565705;
      }
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
      bVar3 = TObjPtr<AActor>::operator==(&this->mate,pAVar6);
      if ((bVar3) && (iVar5 = FRandom::Random(&pr_botmove), iVar5 < 0x20)) {
        TObjPtr<AActor>::operator=(&this->dest,(AActor *)0x0);
      }
    }
  }
  else {
    pAVar2 = this->player->mo;
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    bVar3 = P_CheckSight(&pAVar2->super_AActor,pAVar6,0);
    if (!bVar3) goto LAB_0056501a;
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    Pitch(this,pAVar6);
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
    bVar3 = false;
    if (pAVar6 != (AActor *)0x0) {
      pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_74,(int)pAVar6 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
      bVar3 = uVar4 != 0;
    }
    if (!bVar3) {
LAB_00564c76:
      TObjPtr<AActor>::operator=(&this->dest,(AActor *)0x0);
      if ((this->player->ReadyWeapon != (AWeapon *)0x0) &&
         ((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x200) == 0)) {
        operator~((EnumType)&local_78);
        TFlags<ActorFlag,_unsigned_int>::operator&=
                  (&(this->player->mo->super_AActor).flags,&local_78);
      }
      pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_7c,
                 (int)pAVar6 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
      uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_7c);
      if (uVar4 == 0) {
        this->t_fight = 0x46;
      }
      bVar3 = false;
      if (this->t_strafe < 1) {
        AActor::Pos((DVector3 *)(local_b8 + 8),&this->player->mo->super_AActor);
        operator-(&local_98,(TVector3<double> *)(local_b8 + 8),&this->old);
        dVar9 = TVector3<double>::LengthSquared(&local_98);
        bVar3 = true;
        if (0.5820766091346741 <= dVar9) {
          iVar5 = FRandom::operator()(&pr_botmove);
          bVar3 = iVar5 % 0x1e == 10;
        }
      }
      if (bVar3) {
        local_38[0x17] = 1;
        this->t_strafe = 5;
        this->sleft = (bool)((this->sleft ^ 0xffU) & 1);
      }
      pAVar2 = this->player->mo;
      pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      AActor::AngleTo((AActor *)local_b8,&pAVar2->super_AActor,SUB81(pAVar6,0));
      TAngle<double>::operator=(&this->Angle,(TAngle<double> *)local_b8);
      if (this->player->ReadyWeapon == (AWeapon *)0x0) {
LAB_00564ec5:
        pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_bc,
                   (int)pAVar6 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
        uVar8 = 0x3200;
        if (uVar4 != 0) {
          uVar8 = 0x1900;
        }
        *(undefined2 *)((long)dist + 10) = uVar8;
      }
      else {
        pAVar2 = this->player->mo;
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
        dVar9 = AActor::Distance2D(&pAVar2->super_AActor,pAVar6,false);
        pdVar1 = &this->player->ReadyWeapon->MoveCombatDist;
        if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) goto LAB_00564ec5;
        if ((local_38[0x17] & 1) == 0) {
          pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_c0,
                     (int)pAVar6 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
                    );
          uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c0);
          uVar8 = 0xce00;
          if (uVar4 != 0) {
            uVar8 = 0xe700;
          }
          *(undefined2 *)((long)dist + 10) = uVar8;
        }
      }
      pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
      TFlags<ActorFlag3,_unsigned_int>::operator&
                ((TFlags<ActorFlag3,_unsigned_int> *)((long)&matedist + 4),
                 (int)pAVar6 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
      uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&matedist + 4));
      if (uVar4 == 0) {
        uVar8 = 0x2800;
        if ((this->sleft & 1U) != 0) {
          uVar8 = 0xd800;
        }
        *(undefined2 *)((long)dist + 0xc) = uVar8;
      }
      else {
        uVar8 = 0x1800;
        if ((this->sleft & 1U) != 0) {
          uVar8 = 0xe800;
        }
        *(undefined2 *)((long)dist + 0xc) = uVar8;
      }
      Dofire(this,(ticcmd_t *)dist);
      goto LAB_00565705;
    }
    if ((this->player->mo->super_AActor).health < (this->skill).isp) {
      pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
      pPVar7 = PClass::FindClass("Medikit");
      bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
      if (!bVar3) {
        pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
        pPVar7 = PClass::FindClass("Stimpack");
        bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
        if (!bVar3) {
          pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
          pPVar7 = PClass::FindClass("Soulsphere");
          bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
          if (!bVar3) {
            pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
            pPVar7 = PClass::FindClass("Megasphere");
            bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
            if (!bVar3) {
              pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
              pPVar7 = PClass::FindClass("CrystalVial");
              bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
              if (!bVar3) goto LAB_00564b18;
            }
          }
        }
      }
    }
    else {
LAB_00564b18:
      pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
      pPVar7 = PClass::FindClass("Invulnerability");
      bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
      if (!bVar3) {
        pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
        pPVar7 = PClass::FindClass("Invisibility");
        bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
        if (!bVar3) {
          pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
          pPVar7 = PClass::FindClass("Megasphere");
          bVar3 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
          if ((((!bVar3) && (133.514404296875 <= _r)) &&
              (this->player->ReadyWeapon != (AWeapon *)0x0)) &&
             ((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x200) == 0))
          goto LAB_00564c76;
        }
      }
    }
    if (((534.0576171875 <= _r) && (this->player->ReadyWeapon != (AWeapon *)0x0)) &&
       ((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x200) == 0))
    goto LAB_00564c76;
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
    bVar3 = Reachable(this,pAVar6);
    if (!bVar3) goto LAB_00564c76;
  }
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  local_211 = false;
  if (pAVar6 != (AActor *)0x0) {
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    TAngle<double>::TAngle(&local_e0,90.0);
    local_211 = Check_LOS(this,pAVar6,&local_e0);
  }
  if (local_211 != false) {
    Dofire(this,(ticcmd_t *)dist);
  }
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
  bVar3 = false;
  if (pAVar6 != (AActor *)0x0) {
    pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_e4,(int)pAVar6 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
    bVar3 = false;
    if (uVar4 == 0) {
      pAVar6 = TObjPtr<AActor>::operator->(&this->dest);
      bVar3 = pAVar6->health < 0;
    }
  }
  if (bVar3) {
    TObjPtr<AActor>::operator=(&this->dest,(AActor *)0x0);
  }
  bVar3 = TObjPtr<AActor>::operator==(&this->dest,(AActor *)0x0);
  if (bVar3) {
    if ((this->t_fight == 0) ||
       (pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy),
       pAVar6 == (AActor *)0x0)) {
      local_38._16_4_ = FRandom::operator()(&pr_botmove);
      if ((int)local_38._16_4_ < 0x80) {
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.firstthing);
        TThinkerIterator<AInventory>::TThinkerIterator
                  ((TThinkerIterator<AInventory> *)&item,0x80,&pAVar6->super_DThinker);
        local_110 = TThinkerIterator<AInventory>::Next((TThinkerIterator<AInventory> *)&item);
        if ((local_110 != (AInventory *)0x0) ||
           (local_110 = TThinkerIterator<AInventory>::Next((TThinkerIterator<AInventory> *)&item),
           local_110 != (AInventory *)0x0)) {
          local_38._16_4_ = local_38._16_4_ & 0x3f;
          while (local_38._16_4_ != 0) {
            local_38._16_4_ = local_38._16_4_ - 1;
            local_110 = TThinkerIterator<AInventory>::Next((TThinkerIterator<AInventory> *)&item);
          }
          if (local_110 == (AInventory *)0x0) {
            local_110 = TThinkerIterator<AInventory>::Next((TThinkerIterator<AInventory> *)&item);
          }
          TObjPtr<AActor>::operator=(&bglobal.firstthing,&local_110->super_AActor);
          TObjPtr<AActor>::operator=(&this->dest,&local_110->super_AActor);
        }
      }
      else {
        pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
        if (pAVar6 == (AActor *)0x0) {
LAB_00565641:
          if (((playeringame[(int)(local_38._16_4_ & 7)] & 1U) != 0) &&
             (0 < *(int *)((&players)[(long)(int)(local_38._16_4_ & 7) * 0x54] + 0x1cc))) {
            TObjPtr<AActor>::operator=
                      (&this->dest,(AActor *)(&players)[(long)(int)(local_38._16_4_ & 7) * 0x54]);
          }
        }
        else {
          if (0xb2 < (int)local_38._16_4_) {
            pAVar2 = this->player->mo;
            pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->mate);
            bVar3 = P_CheckSight(&pAVar2->super_AActor,pAVar6,0);
            if (!bVar3) goto LAB_00565641;
          }
          (this->dest).field_0 = (this->mate).field_0;
        }
      }
    }
    else {
      pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
      if (pAVar6->player == (player_t *)0x0) {
        (this->dest).field_0 = (this->enemy).field_0;
      }
      else {
        pAVar6 = TObjPtr<AActor>::operator->(&this->enemy);
        if ((((pAVar6->player->ReadyWeapon == (AWeapon *)0x0) ||
             (pAVar6 = TObjPtr<AActor>::operator->(&this->enemy),
             (*(uint *)&(pAVar6->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x40000000) ==
             0)) && (iVar5 = FRandom::operator()(&pr_botmove), iVar5 % 100 <= (this->skill).isp)) ||
           ((this->player->ReadyWeapon == (AWeapon *)0x0 ||
            ((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x200) != 0))))
        {
          pAVar2 = this->player->mo;
          pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
          AActor::AngleTo((AActor *)&it.super_FThinkerIterator.m_Stat,&pAVar2->super_AActor,
                          SUB81(pAVar6,0));
          TAngle<double>::operator=
                    (&this->Angle,(TAngle<double> *)&it.super_FThinkerIterator.m_Stat);
        }
        else {
          (this->dest).field_0 = (this->enemy).field_0;
        }
      }
    }
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
    if (pAVar6 != (AActor *)0x0) {
      this->t_roam = 0x8c;
    }
  }
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest);
  if (pAVar6 != (AActor *)0x0) {
    Roam(this,(ticcmd_t *)dist);
  }
LAB_00565705:
  if ((this->t_roam == 0) &&
     (pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest), pAVar6 != (AActor *)0x0)
     ) {
    (this->prev).field_0 = (this->dest).field_0;
    TObjPtr<AActor>::operator=(&this->dest,(AActor *)0x0);
  }
  if (this->t_fight < 0x23) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->player->mo->super_AActor).flags,MF_DROPOFF);
  }
  AActor::Pos(&local_138,&this->player->mo->super_AActor);
  TVector2<double>::TVector2(&local_120,&local_138);
  TVector2<double>::operator=(&this->old,&local_120);
  return;
}

Assistant:

void DBot::ThinkForMove (ticcmd_t *cmd)
{
	double dist;
	bool stuck;
	int r;

	stuck = false;
	dist = dest ? player->mo->Distance2D(dest) : 0;

	if (missile &&
		(!missile->Vel.X || !missile->Vel.Y || !Check_LOS(missile, SHOOTFOV*3/2)))
	{
		sleft = !sleft;
		missile = NULL; //Probably ended its travel.
	}

#if 0	// this has always been broken and without any reference it cannot be fixed.
	if (player->mo->Angles.Pitch > 0)
		player->mo->Angles.Pitch -= 80;
	else if (player->mo->Angles.Pitch <= -60)
		player->mo->Angles.Pitch += 80;
#endif

	//HOW TO MOVE:
	if (missile && (player->mo->Distance2D(missile)<AVOID_DIST)) //try avoid missile got from P_Mobj.c thinking part.
	{
		Pitch (missile);
		Angle = player->mo->AngleTo(missile);
		cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		cmd->ucmd.forwardmove = -FORWARDRUN; //Back IS best.

		if ((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			&& t_strafe<=0)
		{
			t_strafe = 5;
			sleft = !sleft;
		}

		//If able to see enemy while avoiding missile, still fire at enemy.
		if (enemy && Check_LOS (enemy, SHOOTFOV)) 
			Dofire (cmd); //Order bot to fire current weapon
	}
	else if (enemy && P_CheckSight (player->mo, enemy, 0)) //Fight!
	{
		Pitch (enemy);

		//Check if it's more important to get an item than fight.
		if (dest && (dest->flags&MF_SPECIAL)) //Must be an item, that is close enough.
		{
#define is(x) dest->IsKindOf (PClass::FindClass (#x))
			if (
				(
				 (player->mo->health < skill.isp &&
				  (is (Medikit) ||
				   is (Stimpack) ||
				   is (Soulsphere) ||
				   is (Megasphere) ||
				   is (CrystalVial)
				  )
				 ) || (
				  is (Invulnerability) ||
				  is (Invisibility) ||
				  is (Megasphere)
				 ) || 
				 dist < (GETINCOMBAT/4) ||
				 (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)
				)
				&& (dist < GETINCOMBAT || (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
				&& Reachable (dest))
#undef is
			{
				goto roam; //Pick it up, no matter the situation. All bonuses are nice close up.
			}
		}

		dest = NULL; //To let bot turn right

		if (player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
			player->mo->flags &= ~MF_DROPOFF; //Don't jump off any ledges when fighting.

		if (!(enemy->flags3 & MF3_ISMONSTER))
			t_fight = AFTERTICS;

		if (t_strafe <= 0 &&
			((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			|| ((pr_botmove()%30)==10))
			)
		{
			stuck = true;
			t_strafe = 5;
			sleft = !sleft;
		}

		Angle = player->mo->AngleTo(enemy);

		if (player->ReadyWeapon == NULL ||
			player->mo->Distance2D(enemy) >
			player->ReadyWeapon->MoveCombatDist)
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? FORWARDWALK : FORWARDRUN;
		}
		else if (!stuck) //Too close, so move away.
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? -FORWARDWALK : -FORWARDRUN;
		}

		//Strafing.
		if (enemy->flags3 & MF3_ISMONSTER) //It's just a monster so take it down cool.
		{
			cmd->ucmd.sidemove = sleft ? -SIDEWALK : SIDEWALK;
		}
		else
		{
			cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		}
		Dofire (cmd); //Order bot to fire current weapon
	}
	else if (mate && !enemy && (!dest || dest==mate)) //Follow mate move.
	{
		double matedist;

		Pitch (mate);

		if (!Reachable (mate))
		{
			if (mate == dest && pr_botmove.Random() < 32)
			{ // [RH] If the mate is the dest, pick a new dest sometimes
				dest = NULL;
			}
			goto roam;
		}

		Angle = player->mo->AngleTo(mate);

		matedist = player->mo->Distance2D(mate);
		if (matedist > (FRIEND_DIST*2))
			cmd->ucmd.forwardmove = FORWARDRUN;
		else if (matedist > FRIEND_DIST)
			cmd->ucmd.forwardmove = FORWARDWALK; //Walk, when starting to get close.
		else if (matedist < FRIEND_DIST-(FRIEND_DIST/3)) //Got too close, so move away.
			cmd->ucmd.forwardmove = -FORWARDWALK;
	}
	else //Roam after something.
	{
		first_shot = true;

	/////
	roam:
	/////
		if (enemy && Check_LOS (enemy, SHOOTFOV*3/2)) //If able to see enemy while avoiding missile , still fire at it.
			Dofire (cmd); //Order bot to fire current weapon

		if (dest && !(dest->flags&MF_SPECIAL) && dest->health < 0)
		{ //Roaming after something dead.
			dest = NULL;
		}

		if (dest == NULL)
		{
			if (t_fight && enemy) //Enemy/bot has jumped around corner. So what to do?
			{
				if (enemy->player)
				{
					if (((enemy->player->ReadyWeapon != NULL && enemy->player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE) ||
						(pr_botmove()%100)>skill.isp) && player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
						dest = enemy;//Dont let enemy kill the bot by supressive fire. So charge enemy.
					else //hide while t_fight, but keep view at enemy.
						Angle = player->mo->AngleTo(enemy);
				} //Just a monster, so kill it.
				else
					dest = enemy;

				//VerifFavoritWeapon(player); //Dont know why here.., but it must be here, i know the reason, but not why at this spot, uh.
			}
			else //Choose a distant target. to get things going.
			{
				r = pr_botmove();
				if (r < 128)
				{
					TThinkerIterator<AInventory> it (MAX_STATNUM+1, bglobal.firstthing);
					AInventory *item = it.Next();

					if (item != NULL || (item = it.Next()) != NULL)
					{
						r &= 63;	// Only scan up to 64 entries at a time
						while (r)
						{
							--r;
							item = it.Next();
						}
						if (item == NULL)
						{
							item = it.Next();
						}
						bglobal.firstthing = item;
						dest = item;
					}
				}
				else if (mate && (r < 179 || P_CheckSight(player->mo, mate)))
				{
					dest = mate;
				}
				else if ((playeringame[(r&(MAXPLAYERS-1))]) && players[(r&(MAXPLAYERS-1))].mo->health > 0)
				{
					dest = players[(r&(MAXPLAYERS-1))].mo; 
				}
			}

			if (dest)
			{
				t_roam = MAXROAM;
			}
		}
		if (dest)
		{ //Bot has a target so roam after it.
			Roam (cmd);
		}

	} //End of movement main part.

	if (!t_roam && dest)
	{
		prev = dest;
		dest = NULL;
	}

	if (t_fight<(AFTERTICS/2))
		player->mo->flags |= MF_DROPOFF;

	old = player->mo->Pos();
}